

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O0

void __thiscall cmCTestScriptHandler::CreateCMake(cmCTestScriptHandler *this)

{
  PositionType *__return_storage_ptr__;
  cmStateSnapshot *__return_storage_ptr___00;
  int recursionDepth;
  cmake *pcVar1;
  cmGlobalGenerator *this_00;
  cmMakefile *pcVar2;
  cmCTestBuildCommand *this_01;
  cmCTestCommand *pcVar3;
  cmCTestCoverageCommand *this_02;
  cmCTestStartCommand *this_03;
  cmCTestSubmitCommand *this_04;
  cmCTestUploadCommand *this_05;
  bool collapse;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  anon_class_8_1_8991fb9c local_138;
  ProgressCallbackType local_130;
  cmStateDirectory local_110;
  cmStateDirectory local_e8;
  undefined1 local_c0 [8];
  string cwd;
  cmStateSnapshot snapshot;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_41;
  string local_40;
  cmCTestScriptHandler *local_10;
  cmCTestScriptHandler *this_local;
  
  local_10 = this;
  if (this->CMake != (cmake *)0x0) {
    pcVar1 = this->CMake;
    if (pcVar1 != (cmake *)0x0) {
      cmake::~cmake(pcVar1);
      operator_delete(pcVar1,0x388);
    }
    if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[1])();
    }
    pcVar2 = this->Makefile;
    if (pcVar2 != (cmMakefile *)0x0) {
      cmMakefile::~cmMakefile(pcVar2);
      operator_delete(pcVar2,0x7e8);
    }
  }
  pcVar1 = (cmake *)operator_new(0x388);
  cmake::cmake(pcVar1,RoleScript,CTest);
  this->CMake = pcVar1;
  pcVar1 = this->CMake;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  cmake::SetHomeDirectory(pcVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  pcVar1 = this->CMake;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_69);
  cmake::SetHomeOutputDirectory(pcVar1,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  __return_storage_ptr__ = &snapshot.Position.Position;
  cmake::GetCurrentSnapshot((cmStateSnapshot *)__return_storage_ptr__,this->CMake);
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)__return_storage_ptr__);
  cmake::AddCMakePaths(this->CMake);
  this_00 = (cmGlobalGenerator *)operator_new(0x608);
  cmGlobalGenerator::cmGlobalGenerator(this_00,this->CMake);
  this->GlobalGenerator = this_00;
  __return_storage_ptr___00 = (cmStateSnapshot *)((long)&cwd.field_2 + 8);
  cmake::GetCurrentSnapshot(__return_storage_ptr___00,this->CMake);
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)local_c0,(SystemTools *)0x1,collapse);
  cmStateSnapshot::GetDirectory(&local_e8,__return_storage_ptr___00);
  cmStateDirectory::SetCurrentSource(&local_e8,(string *)local_c0);
  cmStateSnapshot::GetDirectory(&local_110,(cmStateSnapshot *)((long)&cwd.field_2 + 8));
  cmStateDirectory::SetCurrentBinary(&local_110,(string *)local_c0);
  pcVar2 = (cmMakefile *)operator_new(0x7e8);
  cmMakefile::cmMakefile(pcVar2,this->GlobalGenerator,(cmStateSnapshot *)((long)&cwd.field_2 + 8));
  this->Makefile = pcVar2;
  if (this->ParentMakefile != (cmMakefile *)0x0) {
    pcVar2 = this->Makefile;
    recursionDepth = cmMakefile::GetRecursionDepth(this->ParentMakefile);
    cmMakefile::SetRecursionDepth(pcVar2,recursionDepth);
  }
  pcVar1 = this->CMake;
  local_138.this = this;
  std::function<void(std::__cxx11::string_const&,float)>::
  function<cmCTestScriptHandler::CreateCMake()::__0,void>
            ((function<void(std::__cxx11::string_const&,float)> *)&local_130,&local_138);
  cmake::SetProgressCallback(pcVar1,&local_130);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
  ::~function(&local_130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"ctest_build",&local_159);
  this_01 = (cmCTestBuildCommand *)operator_new(0xb8);
  cmCTestBuildCommand::cmCTestBuildCommand(this_01);
  AddCTestCommand(this,&local_158,(cmCTestCommand *)this_01);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"ctest_configure",&local_181);
  pcVar3 = (cmCTestCommand *)operator_new(0xa8);
  cmCTestConfigureCommand::cmCTestConfigureCommand((cmCTestConfigureCommand *)pcVar3);
  AddCTestCommand(this,&local_180,pcVar3);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"ctest_coverage",&local_1a9);
  this_02 = (cmCTestCoverageCommand *)operator_new(0xe0);
  cmCTestCoverageCommand::cmCTestCoverageCommand(this_02);
  AddCTestCommand(this,&local_1a8,(cmCTestCommand *)this_02);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"ctest_empty_binary_directory",&local_1d1);
  pcVar3 = (cmCTestCommand *)operator_new(0x40);
  cmCTestEmptyBinaryDirectoryCommand::cmCTestEmptyBinaryDirectoryCommand
            ((cmCTestEmptyBinaryDirectoryCommand *)pcVar3);
  AddCTestCommand(this,&local_1d0,pcVar3);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"ctest_memcheck",&local_1f9);
  pcVar3 = (cmCTestCommand *)operator_new(0xa8);
  cmCTestMemCheckCommand::cmCTestMemCheckCommand((cmCTestMemCheckCommand *)pcVar3);
  AddCTestCommand(this,&local_1f8,pcVar3);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"ctest_read_custom_files",&local_221);
  pcVar3 = (cmCTestCommand *)operator_new(0x40);
  cmCTestReadCustomFilesCommand::cmCTestReadCustomFilesCommand
            ((cmCTestReadCustomFilesCommand *)pcVar3);
  AddCTestCommand(this,&local_220,pcVar3);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"ctest_run_script",&local_249);
  pcVar3 = (cmCTestCommand *)operator_new(0x40);
  cmCTestRunScriptCommand::cmCTestRunScriptCommand((cmCTestRunScriptCommand *)pcVar3);
  AddCTestCommand(this,&local_248,pcVar3);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"ctest_sleep",&local_271);
  pcVar3 = (cmCTestCommand *)operator_new(0x40);
  cmCTestSleepCommand::cmCTestSleepCommand((cmCTestSleepCommand *)pcVar3);
  AddCTestCommand(this,&local_270,pcVar3);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"ctest_start",&local_299);
  this_03 = (cmCTestStartCommand *)operator_new(0x48);
  cmCTestStartCommand::cmCTestStartCommand(this_03);
  AddCTestCommand(this,&local_298,(cmCTestCommand *)this_03);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"ctest_submit",&local_2c1)
  ;
  this_04 = (cmCTestSubmitCommand *)operator_new(0x1d8);
  cmCTestSubmitCommand::cmCTestSubmitCommand(this_04);
  AddCTestCommand(this,&local_2c0,(cmCTestCommand *)this_04);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"ctest_test",&local_2e9);
  pcVar3 = (cmCTestCommand *)operator_new(0xa8);
  cmCTestTestCommand::cmCTestTestCommand((cmCTestTestCommand *)pcVar3);
  AddCTestCommand(this,&local_2e8,pcVar3);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"ctest_update",&local_311)
  ;
  pcVar3 = (cmCTestCommand *)operator_new(0xa8);
  cmCTestUpdateCommand::cmCTestUpdateCommand((cmCTestUpdateCommand *)pcVar3);
  AddCTestCommand(this,&local_310,pcVar3);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"ctest_upload",&local_339)
  ;
  this_05 = (cmCTestUploadCommand *)operator_new(0xd8);
  cmCTestUploadCommand::cmCTestUploadCommand(this_05);
  AddCTestCommand(this,&local_338,(cmCTestCommand *)this_05);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  std::__cxx11::string::~string((string *)local_c0);
  return;
}

Assistant:

void cmCTestScriptHandler::CreateCMake()
{
  // create a cmake instance to read the configuration script
  if (this->CMake) {
    delete this->CMake;
    delete this->GlobalGenerator;
    delete this->Makefile;
  }
  this->CMake = new cmake(cmake::RoleScript, cmState::CTest);
  this->CMake->SetHomeDirectory("");
  this->CMake->SetHomeOutputDirectory("");
  this->CMake->GetCurrentSnapshot().SetDefaultDefinitions();
  this->CMake->AddCMakePaths();
  this->GlobalGenerator = new cmGlobalGenerator(this->CMake);

  cmStateSnapshot snapshot = this->CMake->GetCurrentSnapshot();
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  snapshot.GetDirectory().SetCurrentSource(cwd);
  snapshot.GetDirectory().SetCurrentBinary(cwd);
  this->Makefile = new cmMakefile(this->GlobalGenerator, snapshot);
  if (this->ParentMakefile) {
    this->Makefile->SetRecursionDepth(
      this->ParentMakefile->GetRecursionDepth());
  }

  this->CMake->SetProgressCallback(
    [this](const std::string& m, float /*unused*/) {
      if (!m.empty()) {
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "-- " << m << std::endl);
      }
    });

  this->AddCTestCommand("ctest_build", new cmCTestBuildCommand);
  this->AddCTestCommand("ctest_configure", new cmCTestConfigureCommand);
  this->AddCTestCommand("ctest_coverage", new cmCTestCoverageCommand);
  this->AddCTestCommand("ctest_empty_binary_directory",
                        new cmCTestEmptyBinaryDirectoryCommand);
  this->AddCTestCommand("ctest_memcheck", new cmCTestMemCheckCommand);
  this->AddCTestCommand("ctest_read_custom_files",
                        new cmCTestReadCustomFilesCommand);
  this->AddCTestCommand("ctest_run_script", new cmCTestRunScriptCommand);
  this->AddCTestCommand("ctest_sleep", new cmCTestSleepCommand);
  this->AddCTestCommand("ctest_start", new cmCTestStartCommand);
  this->AddCTestCommand("ctest_submit", new cmCTestSubmitCommand);
  this->AddCTestCommand("ctest_test", new cmCTestTestCommand);
  this->AddCTestCommand("ctest_update", new cmCTestUpdateCommand);
  this->AddCTestCommand("ctest_upload", new cmCTestUploadCommand);
}